

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O3

void __thiscall Clasp::DeleteObject::operator()(DeleteObject *this,Accu *p)

{
  pointer ppVar1;
  
  if (p != (Accu *)0x0) {
    ppVar1 = (p->solving_).keys_.ebo_.buf;
    if (ppVar1 != (pointer)0x0) {
      operator_delete(ppVar1);
    }
    ppVar1 = (p->super_StatsMap).keys_.ebo_.buf;
    if (ppVar1 != (pointer)0x0) {
      operator_delete(ppVar1);
    }
  }
  operator_delete(p);
  return;
}

Assistant:

void operator()(T* p) const { delete p; }